

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_nullddi.cpp
# Opt level: O0

ze_result_t
zeGetCommandListExpProcAddrTable(ze_api_version_t version,ze_command_list_exp_dditable_t *pDdiTable)

{
  ze_result_t result;
  ze_command_list_exp_dditable_t *pDdiTable_local;
  ze_api_version_t version_local;
  
  if (pDdiTable == (ze_command_list_exp_dditable_t *)0x0) {
    pDdiTable_local._4_4_ = ZE_RESULT_ERROR_INVALID_NULL_POINTER;
  }
  else if (driver::context < (int)version) {
    pDdiTable_local._4_4_ = ZE_RESULT_ERROR_UNSUPPORTED_VERSION;
  }
  else {
    pDdiTable->pfnGetNextCommandIdWithKernelsExp =
         driver::zeCommandListGetNextCommandIdWithKernelsExp;
    pDdiTable->pfnUpdateMutableCommandKernelsExp =
         driver::zeCommandListUpdateMutableCommandKernelsExp;
    pDdiTable->pfnCreateCloneExp = driver::zeCommandListCreateCloneExp;
    pDdiTable->pfnImmediateAppendCommandListsExp =
         driver::zeCommandListImmediateAppendCommandListsExp;
    pDdiTable->pfnGetNextCommandIdExp = driver::zeCommandListGetNextCommandIdExp;
    pDdiTable->pfnUpdateMutableCommandsExp = driver::zeCommandListUpdateMutableCommandsExp;
    pDdiTable->pfnUpdateMutableCommandSignalEventExp =
         driver::zeCommandListUpdateMutableCommandSignalEventExp;
    pDdiTable->pfnUpdateMutableCommandWaitEventsExp =
         driver::zeCommandListUpdateMutableCommandWaitEventsExp;
    pDdiTable_local._4_4_ = ZE_RESULT_SUCCESS;
  }
  return pDdiTable_local._4_4_;
}

Assistant:

ZE_DLLEXPORT ze_result_t ZE_APICALL
zeGetCommandListExpProcAddrTable(
    ze_api_version_t version,                       ///< [in] API version requested
    ze_command_list_exp_dditable_t* pDdiTable       ///< [in,out] pointer to table of DDI function pointers
    )
{
    if( nullptr == pDdiTable )
        return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

    if( driver::context.version < version )
        return ZE_RESULT_ERROR_UNSUPPORTED_VERSION;

    ze_result_t result = ZE_RESULT_SUCCESS;

    pDdiTable->pfnGetNextCommandIdWithKernelsExp         = driver::zeCommandListGetNextCommandIdWithKernelsExp;

    pDdiTable->pfnUpdateMutableCommandKernelsExp         = driver::zeCommandListUpdateMutableCommandKernelsExp;

    pDdiTable->pfnCreateCloneExp                         = driver::zeCommandListCreateCloneExp;

    pDdiTable->pfnImmediateAppendCommandListsExp         = driver::zeCommandListImmediateAppendCommandListsExp;

    pDdiTable->pfnGetNextCommandIdExp                    = driver::zeCommandListGetNextCommandIdExp;

    pDdiTable->pfnUpdateMutableCommandsExp               = driver::zeCommandListUpdateMutableCommandsExp;

    pDdiTable->pfnUpdateMutableCommandSignalEventExp     = driver::zeCommandListUpdateMutableCommandSignalEventExp;

    pDdiTable->pfnUpdateMutableCommandWaitEventsExp      = driver::zeCommandListUpdateMutableCommandWaitEventsExp;

    return result;
}